

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fluid.cxx
# Opt level: O0

void toggle_widgetbin_cb(Fl_Widget *param_1,void *param_2)

{
  char cVar1;
  uint uVar2;
  void *param_1_local;
  Fl_Widget *param_0_local;
  
  if (widgetbin_panel == (Fl_Window *)0x0) {
    make_widgetbin();
    cVar1 = position_window(widgetbin_panel,"widgetbin_pos",1,0x140,0x1e,0,0);
    if (cVar1 == '\0') {
      return;
    }
  }
  uVar2 = Fl_Widget::visible((Fl_Widget *)widgetbin_panel);
  if (uVar2 == 0) {
    (*(widgetbin_panel->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[5])();
    Fl_Menu_Item::label(widgetbin_item,"Hide Widget &Bin");
  }
  else {
    (*(widgetbin_panel->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[6])();
    Fl_Menu_Item::label(widgetbin_item,"Show Widget &Bin...");
  }
  return;
}

Assistant:

void toggle_widgetbin_cb(Fl_Widget *, void *) {
  if (!widgetbin_panel) {
    make_widgetbin();
    if (!position_window(widgetbin_panel,"widgetbin_pos", 1, 320, 30)) return;
  }

  if (widgetbin_panel->visible()) {
    widgetbin_panel->hide();
    widgetbin_item->label("Show Widget &Bin...");
  } else {
    widgetbin_panel->show();
    widgetbin_item->label("Hide Widget &Bin");
  }
}